

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

AppendResult __thiscall metaf::CloudGroup::appendCeiling(CloudGroup *this,string *group)

{
  char cVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar2;
  int iVar3;
  uint uVar4;
  AppendResult unaff_EBP;
  AppendResult AVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  Unit UVar9;
  _Optional_payload_base<unsigned_int> _Var10;
  Unit UVar11;
  _Optional_payload_base<unsigned_int> _Var12;
  smatch match;
  string_type local_78;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  if (group->_M_string_length == 3) {
    iVar3 = std::__cxx11::string::compare((char *)group);
    UVar11 = FEET;
    if (iVar3 == 0) {
      bVar2 = true;
      uVar7 = 0;
      bVar6 = 0;
    }
    else {
      uVar7 = 0;
      if (2 < group->_M_string_length) {
        lVar8 = 0;
        do {
          cVar1 = (group->_M_dataplus)._M_p[lVar8];
          if ((byte)(cVar1 - 0x3aU) < 0xf6) {
            uVar4 = 0;
            uVar7 = 0;
            goto LAB_001a9d77;
          }
          uVar4 = (uint)(byte)(cVar1 - 0x30) + (int)uVar7 * 10;
          uVar7 = (ulong)uVar4;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 3);
        uVar7 = 0x100000000;
LAB_001a9d77:
        uVar7 = uVar4 | uVar7;
      }
      if ((uVar7 & 0x100000000) == 0) goto LAB_001a9d85;
      uVar7 = (ulong)(uint)((int)uVar7 * 100);
      bVar6 = 1;
      bVar2 = true;
    }
  }
  else {
LAB_001a9d85:
    uVar7 = 0;
    bVar6 = 0;
    UVar11 = METERS;
    bVar2 = false;
  }
  if ((bVar2) && (unaff_EBP = GROUP_INVALIDATED, bVar6 != 0)) {
    (this->heightOrVertVis).distModifier = NONE;
    (this->heightOrVertVis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)((ulong)bVar6 << 0x20 | uVar7);
    (this->heightOrVertVis).distUnit = UVar11;
    this->incompleteText = CIG_NUM;
    unaff_EBP = APPENDED;
  }
  if (bVar2) {
    return unaff_EBP;
  }
  if ((appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_),
     iVar3 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_,"(\\d\\d\\d)V(\\d\\d\\d)"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (group->_M_dataplus)._M_p;
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + group->_M_string_length),&local_58,
                     &appendCeiling(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  AVar5 = GROUP_INVALIDATED;
  if (!bVar2) goto LAB_001a9fd2;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_78,&local_58,1);
  if (local_78._M_string_length == 3) {
    iVar3 = std::__cxx11::string::compare((char *)&local_78);
    bVar2 = true;
    UVar11 = FEET;
    if (iVar3 == 0) {
      _Var12._M_payload = (_Storage<unsigned_int,_true>)0x0;
      _Var12._M_engaged = false;
      _Var12._5_3_ = 0;
    }
    else {
      uVar7 = 0;
      if (2 < local_78._M_string_length) {
        lVar8 = 0;
        do {
          if ((byte)(local_78._M_dataplus._M_p[lVar8] - 0x3aU) < 0xf6) {
            uVar4 = 0;
            uVar7 = 0;
            goto LAB_001a9ea0;
          }
          uVar4 = (uint)(byte)(local_78._M_dataplus._M_p[lVar8] - 0x30) + (int)uVar7 * 10;
          uVar7 = (ulong)uVar4;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 3);
        uVar7 = 0x100000000;
LAB_001a9ea0:
        uVar7 = uVar4 | uVar7;
      }
      if ((uVar7 & 0x100000000) == 0) goto LAB_001a9eae;
      _Var12 = (_Optional_payload_base<unsigned_int>)((ulong)(uint)((int)uVar7 * 100) | 0x100000000)
      ;
    }
  }
  else {
LAB_001a9eae:
    _Var12._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var12._M_engaged = false;
    _Var12._5_3_ = 0;
    UVar11 = METERS;
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) goto LAB_001a9fd2;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_78,&local_58,2);
  if (local_78._M_string_length == 3) {
    iVar3 = std::__cxx11::string::compare((char *)&local_78);
    bVar2 = true;
    UVar9 = FEET;
    if (iVar3 == 0) {
      _Var10._M_payload = (_Storage<unsigned_int,_true>)0x0;
      _Var10._M_engaged = false;
      _Var10._5_3_ = 0;
    }
    else {
      uVar7 = 0;
      if (2 < local_78._M_string_length) {
        lVar8 = 0;
        do {
          if ((byte)(local_78._M_dataplus._M_p[lVar8] - 0x3aU) < 0xf6) {
            uVar4 = 0;
            uVar7 = 0;
            goto LAB_001a9f78;
          }
          uVar4 = (uint)(byte)(local_78._M_dataplus._M_p[lVar8] - 0x30) + (int)uVar7 * 10;
          uVar7 = (ulong)uVar4;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 != 3);
        uVar7 = 0x100000000;
LAB_001a9f78:
        uVar7 = uVar4 | uVar7;
      }
      if ((uVar7 & 0x100000000) == 0) goto LAB_001a9f82;
      _Var10 = (_Optional_payload_base<unsigned_int>)((ulong)(uint)((int)uVar7 * 100) | 0x100000000)
      ;
    }
  }
  else {
LAB_001a9f82:
    _Var10._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var10._M_engaged = false;
    _Var10._5_3_ = 0;
    UVar9 = METERS;
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    AVar5 = APPENDED;
    (this->heightOrVertVis).distModifier = NONE;
    (this->heightOrVertVis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> = _Var12;
    (this->heightOrVertVis).distUnit = UVar11;
    (this->maxHt).distModifier = NONE;
    (this->maxHt).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> = _Var10;
    (this->maxHt).distUnit = UVar9;
    this->tp = VARIABLE_CEILING;
    this->incompleteText = CIG_NUM;
  }
LAB_001a9fd2:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return AVar5;
}

Assistant:

AppendResult CloudGroup::appendCeiling(const std::string & group) {
	if (const auto d = Distance::fromHeightString(group); d.has_value()) {
		if (!d->isReported()) return AppendResult::GROUP_INVALIDATED;
		heightOrVertVis = *d;
		incompleteText = IncompleteText::CIG_NUM;
		return AppendResult::APPENDED;
	}
	static const std::regex rgx ("(\\d\\d\\d)V(\\d\\d\\d)");
	static const auto matchMinHeight = 1, matchMaxHeight = 2;
	std::smatch match;
	if (!std::regex_match(group, match, rgx)) return AppendResult::GROUP_INVALIDATED;
	const auto minH = Distance::fromHeightString(match.str(matchMinHeight));
	if (!minH.has_value()) return AppendResult::GROUP_INVALIDATED;
	const auto maxH = Distance::fromHeightString(match.str(matchMaxHeight));
	if (!maxH.has_value()) return AppendResult::GROUP_INVALIDATED;
	heightOrVertVis = *minH;
	maxHt = *maxH;
	tp = Type::VARIABLE_CEILING;
	incompleteText = IncompleteText::CIG_NUM;
	return AppendResult::APPENDED;
}